

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

string * __thiscall
pbrt::FilterSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,FilterSampler *this)

{
  PiecewiseConstant2D *in_R9;
  
  StringPrintf<pbrt::Bounds2<float>const&,pbrt::Array2D<float>const&,pbrt::PiecewiseConstant2D_const&>
            (__return_storage_ptr__,(pbrt *)"[ FilterSampler domain: %s values: %s distrib: %s ]",
             (char *)this,(Bounds2<float> *)&this->values,(Array2D<float> *)&this->distrib,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string FilterSampler::ToString() const {
    return StringPrintf("[ FilterSampler domain: %s values: %s distrib: %s ]", domain,
                        values, distrib);
}